

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::WriteXMLLabels(cmCTestLaunch *this,cmXMLWriter *xml)

{
  cmXMLWriter *pcVar1;
  bool bVar2;
  reference value;
  allocator local_81;
  string local_80;
  _Self local_60;
  _Self local_58;
  const_iterator li;
  allocator local_39;
  string local_38;
  cmXMLWriter *local_18;
  cmXMLWriter *xml_local;
  cmCTestLaunch *this_local;
  
  local_18 = xml;
  xml_local = (cmXMLWriter *)this;
  LoadLabels(this);
  bVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->Labels);
  if (!bVar2) {
    cmXMLWriter::Comment(local_18,"Interested parties");
    pcVar1 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Labels",&local_39);
    cmXMLWriter::StartElement(pcVar1,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    local_58._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->Labels);
    while( true ) {
      local_60._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Labels);
      bVar2 = std::operator!=(&local_58,&local_60);
      pcVar1 = local_18;
      if (!bVar2) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"Label",&local_81);
      value = std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_58);
      cmXMLWriter::Element<std::__cxx11::string>(pcVar1,&local_80,value);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_58);
    }
    cmXMLWriter::EndElement(local_18);
  }
  return;
}

Assistant:

void cmCTestLaunch::WriteXMLLabels(cmXMLWriter& xml)
{
  this->LoadLabels();
  if(!this->Labels.empty())
    {
    xml.Comment("Interested parties");
    xml.StartElement("Labels");
    for(std::set<std::string>::const_iterator li = this->Labels.begin();
        li != this->Labels.end(); ++li)
      {
      xml.Element("Label", *li);
      }
    xml.EndElement(); // Labels
    }
}